

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::NLProblemBuilder<StrictMockProblemBuilder>::OnHeader
          (NLProblemBuilder<StrictMockProblemBuilder> *this,NLHeader *h)

{
  Argument1 AVar1;
  uint gmock_a1;
  int iVar2;
  
  MockProblemBuilder::SetInfo
            (&(this->builder_->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder,
             &h->super_NLProblemInfo);
  AddVariables(this,h);
  iVar2 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_cons +
          (h->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_cons +
          (h->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_objs +
          (h->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_both +
          (h->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_objs;
  if (iVar2 != 0) {
    MockProblemBuilder::AddCommonExprs
              (&(this->builder_->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder,
               iVar2);
  }
  gmock_a1 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_objs;
  iVar2 = (*this->_vptr_NLProblemBuilder[3])(this);
  if ((char)iVar2 == '\0') {
    iVar2 = (*this->_vptr_NLProblemBuilder[2])(this);
    gmock_a1 = (uint)(0 < (int)gmock_a1 && 0 < iVar2);
  }
  if (gmock_a1 != 0) {
    MockProblemBuilder::AddObjs
              (&(this->builder_->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder,
               gmock_a1);
  }
  AVar1 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_algebraic_cons;
  if (AVar1 != 0) {
    MockProblemBuilder::AddAlgebraicCons
              (&(this->builder_->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder,
               AVar1);
  }
  AVar1 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_logical_cons;
  if (AVar1 != 0) {
    MockProblemBuilder::AddLogicalCons
              (&(this->builder_->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder,
               AVar1);
  }
  AVar1 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs;
  if (AVar1 != 0) {
    MockProblemBuilder::AddFunctions
              (&(this->builder_->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder,
               AVar1);
    return;
  }
  return;
}

Assistant:

void OnHeader(const NLHeader &h) {
    builder_.SetInfo(h);

    // As nl-benchmark shows, adding problem components at once and then
    // updating them is faster than adding them incrementally. The latter
    // requires additional checks to make sure that problem components are
    // in the correct order.
    AddVariables(h);
    if (int n = h.num_common_exprs())
      builder_.AddCommonExprs(n);
    int n_objs = resulting_nobj( h.num_objs );
    if (n_objs != 0)
      builder_.AddObjs( n_objs );
    if (h.num_algebraic_cons != 0)
      builder_.AddAlgebraicCons(h.num_algebraic_cons);
    if (h.num_logical_cons != 0)
      builder_.AddLogicalCons(h.num_logical_cons);
    if (h.num_funcs != 0)
      builder_.AddFunctions(h.num_funcs);
  }